

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChAparticle::ContactForceLoadQ
          (ChAparticle *this,ChVector<double> *F,ChVector<double> *point,ChState *state_x,
          ChVectorDynamic<> *Q,int offset)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  char *__function;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChVector<double> torque_loc;
  ChVector<double> point_loc;
  ChVector<double> force_loc;
  ChCoordsys<double> csys;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  double *local_b8;
  double local_b0;
  double local_a8;
  ChState *local_a0;
  undefined8 local_98;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  ChCoordsys<double> local_68;
  
  local_b8 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_88 = (state_x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_b0 = 3.45845952088873e-323;
  local_98 = 0;
  local_a0 = state_x;
  if (local_88 < 7) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_b8,(type *)0x0);
    ChCoordsys<double>::TransformPointParentToLocal(&local_68,point);
    ChCoordsys<double>::TransformDirectionParentToLocal(&local_68,F);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_b8;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_b0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_70;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_a8;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_80;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_78;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_78 * local_a8;
    auVar7 = vfmsub231sd_fma(auVar14,auVar7,auVar9);
    local_d8 = auVar7._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_70 * (double)local_b8;
    auVar7 = vfmsub231sd_fma(auVar10,auVar12,auVar11);
    uStack_d0 = auVar7._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_80 * local_b0;
    auVar7 = vfmsub231sd_fma(auVar8,auVar6,auVar13);
    local_c8 = auVar7._0_8_;
    if ((-1 < offset) &&
       ((long)offset <=
        (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3))
    {
      pdVar3 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + offset;
      uVar4 = 3;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
        uVar4 = uVar5;
      }
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          pdVar3[uVar5] = F->m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      if (uVar4 < 3) {
        do {
          pdVar3[uVar4] = F->m_data[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      lVar1 = (ulong)(uint)offset + 3;
      if (lVar1 <= (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows + -3) {
        pdVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar3 = pdVar2 + (ulong)(uint)offset + 3;
        uVar4 = 3;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar5 = (ulong)(-((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7), uVar5 < 3)) {
          uVar4 = uVar5;
        }
        if (uVar4 != 0) {
          memcpy(pdVar3,&local_d8,(ulong)(uint)((int)uVar4 * 8));
        }
        if (uVar4 < 3) {
          uVar5 = (ulong)(uint)((int)uVar4 * 8);
          memcpy(pdVar2 + lVar1 + uVar4,(void *)((long)&local_d8 + uVar5),0x18 - uVar5);
        }
        return;
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChAparticle::ContactForceLoadQ(const ChVector<>& F,
                                    const ChVector<>& point,
                                    const ChState& state_x,
                                    ChVectorDynamic<>& Q,
                                    int offset) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> point_loc = csys.TransformPointParentToLocal(point);
    ChVector<> force_loc = csys.TransformDirectionParentToLocal(F);
    ChVector<> torque_loc = Vcross(point_loc, force_loc);
    Q.segment(offset + 0, 3) = F.eigen();
    Q.segment(offset + 3, 3) = torque_loc.eigen();
}